

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       set_caster<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long>
       ::cast<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                 (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  return_value_policy in_SIL;
  undefined8 in_RDI;
  object value_;
  long *value;
  iterator __end0;
  iterator __begin0;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *__range3;
  set s;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  type in_stack_ffffffffffffff78;
  set *in_stack_ffffffffffffff90;
  handle local_50;
  reference local_48;
  _Node_iterator_base<long,_false> local_40;
  _Node_iterator_base<long,_false> local_38;
  undefined8 local_30;
  return_value_policy local_19;
  undefined8 local_18;
  handle local_8;
  
  local_18 = in_RDI;
  local_19 = return_value_policy_override<long,_void>::policy(in_SIL);
  set::set(in_stack_ffffffffffffff90);
  local_30 = local_18;
  local_38._M_cur =
       (__node_type *)
       std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::begin
                 (in_stack_ffffffffffffff68);
  local_40._M_cur =
       (__node_type *)
       std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::end
                 (in_stack_ffffffffffffff68);
  while (bVar1 = std::__detail::operator!=(&local_38,&local_40), bVar1) {
    local_48 = std::__detail::_Node_iterator<long,_true,_false>::operator*
                         ((_Node_iterator<long,_true,_false> *)0x3dd303);
    forward_like<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long_const&>
              (local_48);
    in_stack_ffffffffffffff78 =
         type_caster<long,_void>::cast<long>
                   (CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    (return_value_policy)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                    in_stack_ffffffffffffff78.m_ptr);
    reinterpret_steal<pybind11::object>((handle)in_stack_ffffffffffffff78.m_ptr);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_50);
    if ((bVar1) &&
       (in_stack_ffffffffffffff77 =
             set::add<pybind11::object&>
                       ((set *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                        (object *)in_stack_ffffffffffffff68), (bool)in_stack_ffffffffffffff77)) {
      bVar1 = false;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
      bVar1 = true;
    }
    object::~object((object *)0x3dd3f8);
    if (bVar1) goto LAB_003dd437;
    std::__detail::_Node_iterator<long,_true,_false>::operator++
              ((_Node_iterator<long,_true,_false> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  local_8 = object::release((object *)in_stack_ffffffffffffff68);
LAB_003dd437:
  set::~set((set *)0x3dd441);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }